

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  size_t __n;
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  uchar *__dest;
  uint uVar4;
  ucvector decoded;
  uchar *local_68;
  size_t asStack_60 [3];
  size_t local_48;
  ulong local_40;
  LodePNGDecompressSettings *local_38;
  
  info->iccp_defined = 1;
  local_38 = zlibsettings;
  if (info->iccp_name != (char *)0x0) {
    free(info->iccp_name);
    info->iccp_name = (char *)0x0;
    free(info->iccp_profile);
    info->iccp_profile = (uchar *)0x0;
    info->iccp_profile_size = 0;
    info->iccp_defined = 0;
  }
  if (chunkLength == 0) {
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = (uint)uVar3;
      if (data[uVar3] == '\0') break;
      uVar4 = uVar4 + 1;
      uVar3 = (ulong)uVar4;
    } while (uVar3 < chunkLength);
  }
  local_40 = (ulong)(uVar4 + 2);
  uVar1 = 0x4b;
  if ((local_40 < chunkLength) && (uVar1 = 0x59, 0xffffffb0 < uVar4 - 0x50)) {
    local_48 = (ulong)uVar4 + 1;
    pcVar2 = (char *)malloc(local_48);
    info->iccp_name = pcVar2;
    if (pcVar2 == (char *)0x0) {
      uVar1 = 0x53;
    }
    else {
      pcVar2[uVar3] = '\0';
      if (uVar4 != 0) {
        uVar3 = 0;
        do {
          info->iccp_name[uVar3] = data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      uVar1 = 0x48;
      if ((data[local_48] == '\0') && (uVar1 = 0x4b, local_40 <= chunkLength)) {
        uVar3 = (ulong)(uint)((int)chunkLength - (int)local_40);
        local_68 = (uchar *)0x0;
        asStack_60[0] = 0;
        asStack_60[1] = 0;
        if (local_38->custom_zlib ==
            (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)
            0x0) {
          uVar1 = lodepng_zlib_decompress(&local_68,asStack_60,data + local_40,uVar3,local_38);
        }
        else {
          uVar1 = (*local_38->custom_zlib)(&local_68,asStack_60,data + local_40,uVar3,local_38);
        }
        __n = asStack_60[0];
        if (uVar1 == 0) {
          if (asStack_60[0] == 0) {
            uVar1 = 100;
          }
          else {
            info->iccp_profile_size = (uint)asStack_60[0];
            __dest = (uchar *)malloc(asStack_60[0]);
            info->iccp_profile = __dest;
            if (__dest == (uchar *)0x0) {
              uVar1 = 0x53;
            }
            else {
              memcpy(__dest,local_68,__n);
              uVar1 = 0;
            }
          }
        }
        asStack_60[0] = 0;
        asStack_60[1] = 0;
        free(local_68);
      }
    }
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  unsigned length, string2_begin;
  ucvector decoded;

  info->iccp_defined = 1;
  if(info->iccp_name) lodepng_clear_icc(info);

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  ucvector_init(&decoded);
  error = zlib_decompress(&decoded.data, &decoded.size,
                          &data[string2_begin],
                          length, zlibsettings);
  if(!error) {
    if(decoded.size) {
      info->iccp_profile_size = decoded.size;
      info->iccp_profile = (unsigned char*)lodepng_malloc(decoded.size);
      if(info->iccp_profile) {
        lodepng_memcpy(info->iccp_profile, decoded.data, decoded.size);
      } else {
        error = 83; /* alloc fail */
      }
    } else {
      error = 100; /*invalid ICC profile size*/
    }
  }
  ucvector_cleanup(&decoded);
  return error;
}